

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

uint64_t __thiscall
Imf_3_4::Compressor::runEncodeStep
          (Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  int iVar1;
  exr_context_t p_Var2;
  ArgExc *pAVar3;
  undefined8 in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  exr_chunk_info_t cinfo;
  undefined1 local_70 [22];
  undefined1 local_5a;
  undefined8 *local_30;
  int local_1c;
  undefined8 local_18;
  uint64_t local_8;
  
  if (in_EDX == 0) {
    *in_R8 = in_RSI;
    local_8 = 0;
  }
  else {
    local_30 = in_R8;
    local_1c = in_EDX;
    local_18 = in_RSI;
    memset(local_70,0,0x40);
    p_Var2 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x18e5bd);
    iVar1 = exr_chunk_default_initialize
                      (p_Var2,0,in_RCX,*(undefined4 *)(in_RDI + 0x450),
                       *(undefined4 *)(in_RDI + 0x454),local_70);
    if (iVar1 != 0) {
      pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar3,"Unable to initialize chunk information");
      __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    local_5a = (undefined1)*(undefined4 *)(in_RDI + 0x30);
    if ((*(byte *)(in_RDI + 0x431) & 1) == 0) {
      p_Var2 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x18e66a);
      iVar1 = exr_encoding_initialize(p_Var2,0,local_70,in_RDI + 0x230);
      if (iVar1 != 0) {
        pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar3,"Unable to initialize encoder type");
        __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      *(undefined1 *)(in_RDI + 0x431) = 1;
    }
    else {
      p_Var2 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x18e704);
      iVar1 = exr_encoding_update(p_Var2,0,local_70,in_RDI + 0x230);
      if (iVar1 != 0) {
        pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar3,"Unable to update encoder type");
        __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
    }
    *(undefined8 *)(in_RDI + 0x298) = local_18;
    *(long *)(in_RDI + 0x2a0) = (long)local_1c;
    iVar1 = exr_compress_chunk(in_RDI + 0x230);
    if (iVar1 != 0) {
      pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar3,"Unable to run compression routine");
      __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    *local_30 = *(undefined8 *)(in_RDI + 0x2d8);
    *(undefined8 *)(in_RDI + 0x298) = 0;
    *(undefined8 *)(in_RDI + 0x2a0) = 0;
    local_8 = *(uint64_t *)(in_RDI + 0x2e0);
  }
  return local_8;
}

Assistant:

uint64_t
Compressor::runEncodeStep (
    const char* inPtr,
    int inSize,
    IMATH_NAMESPACE::Box2i range,
    const char*& outPtr)
{
    // special case
    if (inSize == 0)
    {
        outPtr = inPtr;
        return 0;
    }

    exr_chunk_info_t cinfo = {0};

    if (EXR_ERR_SUCCESS != exr_chunk_default_initialize (
            _ctxt, 0, (const exr_attr_box2i_t*) &range, _levelX, _levelY, &cinfo))
        throw IEX_NAMESPACE::ArgExc ("Unable to initialize chunk information");

    cinfo.type = _store_type;
    if (!_encoder_init)
    {
        if (EXR_ERR_SUCCESS != exr_encoding_initialize(_ctxt, 0, &cinfo, &_encoder))
            throw IEX_NAMESPACE::ArgExc ("Unable to initialize encoder type");

        _encoder_init = true;
    }
    else
    {
        if (EXR_ERR_SUCCESS != exr_encoding_update(_ctxt, 0, &cinfo, &_encoder))
            throw IEX_NAMESPACE::ArgExc ("Unable to update encoder type");
    }

    _encoder.packed_buffer = const_cast<char*> (inPtr);
    _encoder.packed_bytes = inSize;

    if (EXR_ERR_SUCCESS != exr_compress_chunk(&_encoder))
        throw IEX_NAMESPACE::ArgExc ("Unable to run compression routine");

    outPtr = (const char*) _encoder.compressed_buffer;

    _encoder.packed_buffer = nullptr;
    _encoder.packed_bytes = 0;

    return _encoder.compressed_bytes;
}